

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteCollectionFetchRecordById(unqlite_col *pCol,jx9_int64 nId,jx9_value *pValue)

{
  SyBlob *pBlob;
  unqlite_col_record *puVar1;
  int local_3c;
  int rc;
  unqlite_col_record *pRec;
  SyBlob *pWorker;
  jx9_value *pValue_local;
  jx9_int64 nId_local;
  unqlite_col *pCol_local;
  
  pBlob = &pCol->sWorker;
  jx9_value_null(pValue);
  puVar1 = CollectionCacheFetchRecord(pCol,nId);
  if (puVar1 == (unqlite_col_record *)0x0) {
    SyBlobReset(pBlob);
    SyBlobFormat(pBlob,"%z_%qd",&pCol->sName,nId);
    unqlite_kv_cursor_reset(pCol->pCursor);
    local_3c = unqlite_kv_cursor_seek(pCol->pCursor,(pCol->sWorker).pBlob,(pCol->sWorker).nByte,1);
    pCol_local._4_4_ = local_3c;
    if (local_3c == 0) {
      SyBlobReset(pBlob);
      unqlite_kv_cursor_data_callback(pCol->pCursor,unqliteDataConsumer,pBlob);
      if ((pCol->sWorker).nByte == 0) {
        unqliteGenErrorFormat(pCol->pVm->pDb,"Empty record \'%qd\'",nId);
        jx9_value_null(pValue);
      }
      else {
        local_3c = FastJsonDecode((pCol->sWorker).pBlob,(pCol->sWorker).nByte,pValue,(uchar **)0x0,0
                                 );
        if (local_3c == 0) {
          CollectionCacheInstallRecord(pCol,nId,pValue);
        }
      }
      pCol_local._4_4_ = local_3c;
    }
  }
  else {
    jx9MemObjStore(&puVar1->sValue,pValue);
    pCol_local._4_4_ = 0;
  }
  return pCol_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionFetchRecordById(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId,     /* Unique record ID */
	jx9_value *pValue  /* OUT: record value */
	)
{
	SyBlob *pWorker = &pCol->sWorker;
	unqlite_col_record *pRec;
	int rc;
	jx9_value_null(pValue);
	/* Perform a cache lookup first */
	pRec = CollectionCacheFetchRecord(pCol,nId);
	if( pRec ){
		/* Copy record value */
		jx9MemObjStore(&pRec->sValue,pValue);
		return UNQLITE_OK;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	/* Generate the unique ID */
	SyBlobFormat(pWorker,"%z_%qd",&pCol->sName,nId);
	/* Reset the cursor */
	unqlite_kv_cursor_reset(pCol->pCursor);
	/* Seek the cursor to the desired location */
	rc = unqlite_kv_cursor_seek(pCol->pCursor,
		SyBlobData(pWorker),SyBlobLength(pWorker),
		UNQLITE_CURSOR_MATCH_EXACT
		);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Consume the binary JSON */
	SyBlobReset(pWorker);
	unqlite_kv_cursor_data_callback(pCol->pCursor,unqliteDataConsumer,pWorker);
	if( SyBlobLength(pWorker) < 1 ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
			"Empty record '%qd'",nId
			);
		jx9_value_null(pValue);
	}else{
		/* Decode the binary JSON */
		rc = FastJsonDecode(SyBlobData(pWorker),SyBlobLength(pWorker),pValue,0,0);
		if( rc == UNQLITE_OK ){
			/* Install the record in the cache */
			CollectionCacheInstallRecord(pCol,nId,pValue);
		}
	}
	return rc;
}